

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

void __thiscall
Clasp::WeightConstraint::reason(WeightConstraint *this,Solver *s,Literal p,LitVec *r)

{
  WL WVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Literal local_2c;
  
  WVar1 = *this->lits_;
  if ((int)WVar1 < 0) {
    uVar2 = 0xffffffff;
    if (p.rep_ >> 2 < (s->assign_).reason_.data_.ebo_.size) {
      uVar2 = (s->assign_).reason_.data_.ebo_.buf[p.rep_ >> 2];
    }
  }
  else {
    uVar2 = *(uint *)&this->field_0x10 & 0x7ffffff;
  }
  if ((uint)WVar1 >> 0x1f != uVar2) {
    uVar4 = (ulong)((uint)WVar1 >> 0x1f);
    do {
      uVar3 = (uint)this->bound_[uVar4 + 2] >> 1 & 1;
      if (uVar3 == (*(uint *)&this->field_0x10 >> 0x1c & 3)) {
        local_2c.rep_ =
             (uint)this->lits_
                   [(ulong)(((uint)this->bound_[uVar4 + 2] >> 2) << (SUB41(*this->lits_,3) >> 7)) +
                    1] & 0xfffffffe ^ uVar3 * 2 ^ 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(r,&local_2c);
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != (uint)uVar4);
  }
  return;
}

Assistant:

void WeightConstraint::reason(Solver& s, Literal p, LitVec& r) {
	assert(active_ != NOT_ACTIVE);
	Literal x;
	uint32 stop = !isWeight() ? up_ : s.reasonData(p);
	assert(stop <= up_);
	for (uint32 i = undoStart(); i != stop; ++i) {
		UndoInfo u = undo_[i];
		// Consider only lits that are relevant to the active constraint
		if (u.constraint() == (ActiveConstraint)active_) {
			x = lit(u.idx(), u.constraint());
			r.push_back( ~x );
		}
	}
}